

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::PrintCommandTrace(cmMakefile *this,cmListFileFunction *lff)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  cmake *this_00;
  pointer pcVar4;
  char *m1;
  string local_210 [32];
  __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
  local_1f0;
  __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
  local_1e8;
  const_iterator i;
  string temp;
  bool expand;
  string local_1b0;
  undefined1 local_190 [8];
  ostringstream msg;
  cmListFileFunction *lff_local;
  cmMakefile *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  GetExecutionFilePath_abi_cxx11_(&local_1b0,this);
  poVar3 = std::operator<<((ostream *)local_190,(string *)&local_1b0);
  poVar3 = std::operator<<(poVar3,"(");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(lff->super_cmCommandContext).Line);
  std::operator<<(poVar3,"):  ");
  std::__cxx11::string::~string((string *)&local_1b0);
  poVar3 = std::operator<<((ostream *)local_190,(string *)lff);
  std::operator<<(poVar3,"(");
  this_00 = GetCMakeInstance(this);
  bVar1 = cmake::GetTraceExpand(this_00);
  std::__cxx11::string::string((string *)&i);
  local_1e8._M_current =
       (cmListFileArgument *)
       std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::begin(&lff->Arguments);
  while( true ) {
    local_1f0._M_current =
         (cmListFileArgument *)
         std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::end(&lff->Arguments);
    bVar2 = __gnu_cxx::operator!=(&local_1e8,&local_1f0);
    if (!bVar2) break;
    if (bVar1) {
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
               ::operator->(&local_1e8);
      std::__cxx11::string::operator=((string *)&i,(string *)pcVar4);
      ExpandVariablesInString(this,(string *)&i);
      std::operator<<((ostream *)local_190,(string *)&i);
    }
    else {
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
               ::operator->(&local_1e8);
      std::operator<<((ostream *)local_190,(string *)pcVar4);
    }
    std::operator<<((ostream *)local_190," ");
    __gnu_cxx::
    __normal_iterator<const_cmListFileArgument_*,_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_>
    ::operator++(&local_1e8);
  }
  std::operator<<((ostream *)local_190,")");
  std::__cxx11::ostringstream::str();
  m1 = (char *)std::__cxx11::string::c_str();
  cmSystemTools::Message(m1,(char *)0x0);
  std::__cxx11::string::~string(local_210);
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return;
}

Assistant:

void cmMakefile::PrintCommandTrace(const cmListFileFunction& lff) const
{
  std::ostringstream msg;
  msg << this->GetExecutionFilePath() << "(" << lff.Line << "):  ";
  msg << lff.Name << "(";
  bool expand = this->GetCMakeInstance()->GetTraceExpand();
  std::string temp;
  for(std::vector<cmListFileArgument>::const_iterator i =
        lff.Arguments.begin(); i != lff.Arguments.end(); ++i)
    {
    if (expand)
      {
      temp = i->Value;
      this->ExpandVariablesInString(temp);
      msg << temp;
      }
    else
      {
      msg << i->Value;
      }
    msg << " ";
    }
  msg << ")";
  cmSystemTools::Message(msg.str().c_str());
}